

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

CNode * __thiscall CConnman::FindNode(CConnman *this,string *addrName)

{
  pointer ppCVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  CNode *pCVar3;
  pointer ppCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 != ppCVar1) {
    __s2 = (addrName->_M_dataplus)._M_p;
    __n = addrName->_M_string_length;
    do {
      pCVar3 = *ppCVar4;
      if ((pCVar3->m_addr_name)._M_string_length == __n) {
        if (__n == 0) goto LAB_008b59ec;
        iVar2 = bcmp((pCVar3->m_addr_name)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) goto LAB_008b59ec;
      }
      ppCVar4 = ppCVar4 + 1;
    } while (ppCVar4 != ppCVar1);
  }
  pCVar3 = (CNode *)0x0;
LAB_008b59ec:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pCVar3;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::FindNode(const std::string& addrName)
{
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (pnode->m_addr_name == addrName) {
            return pnode;
        }
    }
    return nullptr;
}